

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86.cpp
# Opt level: O0

int __thiscall ncnn::ELU_x86::forward_inplace(ELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long *in_RSI;
  long *in_RDI;
  float fVar3;
  int iVar4;
  float fVar6;
  float fVar7;
  undefined1 auVar5 [16];
  float fVar8;
  undefined1 auVar9 [16];
  __m128 _p;
  __m128 _alpha128;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  Mat *m;
  __m128 neg;
  __m128 pos;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  int local_810;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined8 local_7f0;
  undefined4 local_7e8;
  long local_7e0;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined8 local_7c0;
  undefined1 (*local_7b8) [16];
  int local_7b0;
  int local_7ac;
  int local_7a8;
  int local_7a4;
  int local_7a0;
  int local_79c;
  long *local_790;
  undefined1 local_77d;
  int local_77c;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_758;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  float local_738;
  undefined1 (*pauStack_730) [16];
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  undefined1 (*local_710) [16];
  undefined8 local_708;
  undefined8 uStack_700;
  undefined1 local_6f8 [8];
  float fStack_6f0;
  float fStack_6ec;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined4 local_6c8;
  undefined4 uStack_6c4;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  undefined4 local_6b8;
  long local_6a8;
  undefined4 local_69c;
  long local_698;
  undefined1 (*local_690) [16];
  undefined4 local_684;
  int local_680;
  int local_67c;
  undefined8 *local_678;
  undefined4 local_66c;
  long local_668;
  undefined8 *local_648;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  ulong local_368;
  ulong uStack_360;
  undefined8 *local_350;
  float *local_348;
  float *local_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318 [2];
  float afStack_310 [2];
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  float *local_2e8;
  float *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float local_2b8 [2];
  float afStack_2b0 [2];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  float *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  float local_218 [2];
  float afStack_210 [2];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  float local_1b8 [2];
  float afStack_1b0 [2];
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  float *local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  float local_158 [2];
  float afStack_150 [2];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  float local_f8 [2];
  float afStack_f0 [2];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  float local_98 [2];
  float afStack_90 [2];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_79c = *(int *)((long)in_RSI + 0x2c);
  local_7a0 = (int)in_RSI[6];
  local_7a4 = (int)in_RSI[7];
  local_7a8 = (int)in_RSI[3];
  local_7ac = local_79c * local_7a0 * local_7a8;
  local_790 = in_RSI;
  for (local_7b0 = 0; local_7b0 < local_7a4; local_7b0 = local_7b0 + 1) {
    local_770 = &local_800;
    local_67c = *(int *)((long)local_790 + 0x2c);
    local_680 = (int)local_790[6];
    local_684 = *(undefined4 *)((long)local_790 + 0x34);
    local_690 = (undefined1 (*) [16])(*local_790 + local_790[8] * (long)local_7b0 * local_790[2]);
    local_698 = local_790[2];
    local_69c = (undefined4)local_790[3];
    local_6a8 = local_790[4];
    local_678 = &local_800;
    local_668 = (long)local_67c * (long)local_680 * local_698;
    local_768 = &local_800;
    local_758 = &local_800;
    local_66c = 0x10;
    local_77c = local_7b0;
    local_77d = 1;
    local_800 = 0;
    local_7f0 = 0;
    local_7e8 = 0;
    local_7d8 = 0;
    local_7d4 = 0;
    local_7d0 = 0;
    local_7cc = 0;
    local_7c8 = 0;
    local_7c0 = 0;
    local_7f8 = 0;
    local_810 = 0;
    local_748 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    local_7b8 = local_690;
    for (; fStack_744 = local_748, fStack_740 = local_748, fStack_73c = local_748,
        local_738 = local_748, local_648 = local_758, local_7e0 = local_6a8,
        local_810 + 3 < local_7ac; local_810 = local_810 + 4) {
      pauStack_730 = local_7b8;
      local_6d8 = *(undefined8 *)*local_7b8;
      uStack_6d0 = *(undefined8 *)(*local_7b8 + 8);
      local_710 = local_7b8;
      local_5e8 = 0;
      uStack_5e0 = 0;
      local_608 = 0;
      uStack_600 = 0;
      _local_6f8 = maxps(ZEXT816(0),*local_7b8);
      local_5f8 = 0;
      uStack_5f0 = 0;
      local_5c8 = 0;
      uStack_5c0 = 0;
      auVar9 = minps(ZEXT816(0),*local_7b8);
      local_708 = auVar9._0_8_;
      uStack_700 = auVar9._8_8_;
      local_4f8 = 0;
      uStack_4f0 = 0;
      local_568 = 0x3f8000003f800000;
      uStack_560 = 0x3f8000003f800000;
      local_4d8 = local_708;
      uStack_4d0 = uStack_700;
      local_4e8 = 0x42b0c0a542b0c0a5;
      uStack_4e0 = 0x42b0c0a542b0c0a5;
      auVar5._8_8_ = 0x42b0c0a542b0c0a5;
      auVar5._0_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = minps(auVar9,auVar5);
      local_528 = auVar5._0_8_;
      local_508 = local_528;
      uStack_520 = auVar5._8_8_;
      uStack_500 = uStack_520;
      local_518 = 0xc2b0c0a5c2b0c0a5;
      uStack_510 = 0xc2b0c0a5c2b0c0a5;
      auVar9._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar9._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar9 = maxps(auVar5,auVar9);
      local_528 = auVar9._0_8_;
      uVar1 = local_528;
      uStack_520 = auVar9._8_8_;
      uVar2 = uStack_520;
      local_408 = 0x3fb8aa3b3fb8aa3b;
      uStack_400 = 0x3fb8aa3b3fb8aa3b;
      local_3f8._0_4_ = auVar9._0_4_;
      local_3f8._4_4_ = auVar9._4_4_;
      uStack_3f0._0_4_ = auVar9._8_4_;
      uStack_3f0._4_4_ = auVar9._12_4_;
      local_478 = CONCAT44(local_3f8._4_4_ * 1.442695,(float)local_3f8 * 1.442695);
      uStack_470 = CONCAT44(uStack_3f0._4_4_ * 1.442695,(float)uStack_3f0 * 1.442695);
      local_488 = 0x3f0000003f000000;
      uStack_480 = 0x3f0000003f000000;
      fVar3 = (float)local_3f8 * 1.442695 + 0.5;
      fVar6 = local_3f8._4_4_ * 1.442695 + 0.5;
      fVar7 = (float)uStack_3f0 * 1.442695 + 0.5;
      fVar8 = uStack_3f0._4_4_ * 1.442695 + 0.5;
      local_3b8 = CONCAT44(fVar6,fVar3);
      uStack_3b0 = CONCAT44(fVar8,fVar7);
      local_3a8 = CONCAT44((int)fVar6,(int)fVar3);
      uStack_3a0 = CONCAT44((int)fVar8,(int)fVar7);
      local_548 = (float)(int)fVar3;
      fStack_544 = (float)(int)fVar6;
      fStack_540 = (float)(int)fVar7;
      fStack_53c = (float)(int)fVar8;
      local_538 = CONCAT44(fStack_544,local_548);
      uStack_530 = CONCAT44(fStack_53c,fStack_540);
      local_388 = local_538;
      uStack_380 = uStack_530;
      local_398 = CONCAT44(fVar6,fVar3);
      uStack_390 = CONCAT44(fVar8,fVar7);
      local_578 = CONCAT44(-(uint)(fVar6 < fStack_544),-(uint)(fVar3 < local_548));
      uStack_570 = CONCAT44(-(uint)(fVar8 < fStack_53c),-(uint)(fVar7 < fStack_540));
      local_368 = local_578;
      uStack_360 = uStack_570;
      local_378 = 0x3f8000003f800000;
      uStack_370 = 0x3f8000003f800000;
      local_578 = local_578 & 0x3f8000003f800000;
      uStack_570 = uStack_570 & 0x3f8000003f800000;
      local_4b8 = local_538;
      uStack_4b0 = uStack_530;
      local_4c8._0_4_ = (float)local_578;
      local_4c8._4_4_ = (float)(local_578 >> 0x20);
      uStack_4c0._0_4_ = (float)uStack_570;
      uStack_4c0._4_4_ = (float)(uStack_570 >> 0x20);
      local_548 = local_548 - (float)local_4c8;
      fStack_544 = fStack_544 - local_4c8._4_4_;
      fStack_540 = fStack_540 - (float)uStack_4c0;
      fStack_53c = fStack_53c - uStack_4c0._4_4_;
      local_340 = &local_548;
      local_2e8 = ::_ps_cephes_exp_C1;
      local_350 = &local_528;
      local_2c8 = local_528;
      uStack_2c0 = uStack_520;
      local_2a8 = CONCAT44(fStack_544,local_548);
      uStack_2a0 = CONCAT44(fStack_53c,fStack_540);
      local_2b8[0] = 0.6933594;
      local_2b8[1] = 0.6933594;
      afStack_2b0[0] = 0.6933594;
      afStack_2b0[1] = 0.6933594;
      local_2d8 = local_548 * 0.6933594;
      fStack_2d4 = fStack_544 * 0.6933594;
      fStack_2d0 = fStack_540 * 0.6933594;
      fStack_2cc = fStack_53c * 0.6933594;
      local_528 = CONCAT44(local_3f8._4_4_ - fStack_2d4,(float)local_3f8 - local_2d8);
      uStack_520._0_4_ = (float)uStack_3f0 - fStack_2d0;
      uStack_520._4_4_ = uStack_3f0._4_4_ - fStack_2cc;
      local_348 = ::_ps_cephes_exp_C2;
      local_328 = local_528;
      uStack_320 = uStack_520;
      local_308 = CONCAT44(fStack_544,local_548);
      uStack_300 = CONCAT44(fStack_53c,fStack_540);
      local_318[0] = -0.00021219444;
      local_318[1] = -0.00021219444;
      afStack_310[0] = -0.00021219444;
      afStack_310[1] = -0.00021219444;
      local_338 = local_548 * -0.00021219444;
      fStack_334 = fStack_544 * -0.00021219444;
      fStack_330 = fStack_540 * -0.00021219444;
      fStack_32c = fStack_53c * -0.00021219444;
      fVar3 = ((float)local_3f8 - local_2d8) - local_338;
      fVar6 = (local_3f8._4_4_ - fStack_2d4) - fStack_334;
      fVar7 = ((float)uStack_3f0 - fStack_2d0) - fStack_330;
      fVar8 = (uStack_3f0._4_4_ - fStack_2cc) - fStack_32c;
      local_528 = CONCAT44(fVar6,fVar3);
      uStack_520._0_4_ = fVar7;
      uStack_520._4_4_ = fVar8;
      local_428 = local_528;
      uStack_420 = uStack_520;
      local_538 = CONCAT44(fVar6 * fVar6,fVar3 * fVar3);
      uStack_530 = CONCAT44(fVar8 * fVar8,fVar7 * fVar7);
      local_280 = &local_588;
      local_b0 = ::_ps_cephes_exp_p1;
      local_68 = 0x3950696739506967;
      uStack_60 = 0x3950696739506967;
      local_78 = local_528;
      uStack_70 = uStack_520;
      local_88 = fVar3 * 0.00019875691;
      fStack_84 = fVar6 * 0.00019875691;
      fStack_80 = fVar7 * 0.00019875691;
      fStack_7c = fVar8 * 0.00019875691;
      local_98[0] = 0.0013981999;
      local_98[1] = 0.0013981999;
      afStack_90[0] = 0.0013981999;
      afStack_90[1] = 0.0013981999;
      local_588 = CONCAT44(fStack_84 + 0.0013981999,local_88 + 0.0013981999);
      uStack_580 = CONCAT44(fStack_7c + 0.0013981999,fStack_80 + 0.0013981999);
      local_110 = ::_ps_cephes_exp_p2;
      local_c8 = local_588;
      uStack_c0 = uStack_580;
      local_d8 = local_528;
      uStack_d0 = uStack_520;
      local_e8 = (local_88 + 0.0013981999) * fVar3;
      fStack_e4 = (fStack_84 + 0.0013981999) * fVar6;
      fStack_e0 = (fStack_80 + 0.0013981999) * fVar7;
      fStack_dc = (fStack_7c + 0.0013981999) * fVar8;
      local_f8[0] = 0.008333452;
      local_f8[1] = 0.008333452;
      afStack_f0[0] = 0.008333452;
      afStack_f0[1] = 0.008333452;
      local_588 = CONCAT44(fStack_e4 + 0.008333452,local_e8 + 0.008333452);
      uStack_580 = CONCAT44(fStack_dc + 0.008333452,fStack_e0 + 0.008333452);
      local_170 = ::_ps_cephes_exp_p3;
      local_128 = local_588;
      uStack_120 = uStack_580;
      local_138 = local_528;
      uStack_130 = uStack_520;
      local_148 = (local_e8 + 0.008333452) * fVar3;
      fStack_144 = (fStack_e4 + 0.008333452) * fVar6;
      fStack_140 = (fStack_e0 + 0.008333452) * fVar7;
      fStack_13c = (fStack_dc + 0.008333452) * fVar8;
      local_158[0] = 0.041665796;
      local_158[1] = 0.041665796;
      afStack_150[0] = 0.041665796;
      afStack_150[1] = 0.041665796;
      local_588 = CONCAT44(fStack_144 + 0.041665796,local_148 + 0.041665796);
      uStack_580 = CONCAT44(fStack_13c + 0.041665796,fStack_140 + 0.041665796);
      local_1d0 = ::_ps_cephes_exp_p4;
      local_188 = local_588;
      uStack_180 = uStack_580;
      local_198 = local_528;
      uStack_190 = uStack_520;
      local_1a8 = (local_148 + 0.041665796) * fVar3;
      fStack_1a4 = (fStack_144 + 0.041665796) * fVar6;
      fStack_1a0 = (fStack_140 + 0.041665796) * fVar7;
      fStack_19c = (fStack_13c + 0.041665796) * fVar8;
      local_1b8[0] = 0.16666666;
      local_1b8[1] = 0.16666666;
      afStack_1b0[0] = 0.16666666;
      afStack_1b0[1] = 0.16666666;
      local_588 = CONCAT44(fStack_1a4 + 0.16666666,local_1a8 + 0.16666666);
      uStack_580 = CONCAT44(fStack_19c + 0.16666666,fStack_1a0 + 0.16666666);
      local_230 = ::_ps_cephes_exp_p5;
      local_1e8 = local_588;
      uStack_1e0 = uStack_580;
      local_1f8 = local_528;
      uStack_1f0 = uStack_520;
      local_208 = (local_1a8 + 0.16666666) * fVar3;
      fStack_204 = (fStack_1a4 + 0.16666666) * fVar6;
      fStack_200 = (fStack_1a0 + 0.16666666) * fVar7;
      fStack_1fc = (fStack_19c + 0.16666666) * fVar8;
      local_218[0] = 0.5;
      local_218[1] = 0.5;
      afStack_210[0] = 0.5;
      afStack_210[1] = 0.5;
      local_588 = CONCAT44(fStack_204 + 0.5,local_208 + 0.5);
      uStack_580 = CONCAT44(fStack_1fc + 0.5,fStack_200 + 0.5);
      local_288 = &local_538;
      local_248 = local_588;
      uStack_240 = uStack_580;
      local_258 = local_538;
      uStack_250 = uStack_530;
      local_268 = (local_208 + 0.5) * fVar3 * fVar3;
      fStack_264 = (fStack_204 + 0.5) * fVar6 * fVar6;
      fStack_260 = (fStack_200 + 0.5) * fVar7 * fVar7;
      fStack_25c = (fStack_1fc + 0.5) * fVar8 * fVar8;
      local_278 = local_528;
      uStack_270 = uStack_520;
      local_588 = CONCAT44(fStack_264 + fVar6,local_268 + fVar3);
      uStack_580 = CONCAT44(fStack_25c + fVar8,fStack_260 + fVar7);
      local_498 = local_588;
      uStack_490 = uStack_580;
      local_4a8 = 0x3f8000003f800000;
      uStack_4a0 = 0x3f8000003f800000;
      local_468 = local_268 + fVar3 + 1.0;
      fStack_464 = fStack_264 + fVar6 + 1.0;
      fStack_460 = fStack_260 + fVar7 + 1.0;
      fStack_45c = fStack_25c + fVar8 + 1.0;
      local_588 = CONCAT44(fStack_464,local_468);
      uStack_580 = CONCAT44(fStack_45c,fStack_460);
      local_3c8 = CONCAT44(fStack_544,local_548);
      uStack_3c0 = CONCAT44(fStack_53c,fStack_540);
      local_48 = CONCAT44((int)fStack_544,(int)local_548);
      uStack_40 = CONCAT44((int)fStack_53c,(int)fStack_540);
      local_58 = 0x7f0000007f;
      uStack_50 = 0x7f0000007f;
      iVar4 = (int)local_548 + 0x7f;
      fStack_554 = (float)((int)fStack_544 + 0x7f);
      fStack_550 = (float)((int)fStack_540 + 0x7f);
      fStack_54c = (float)((int)fStack_53c + 0x7f);
      local_28 = CONCAT44(fStack_554,iVar4);
      uStack_20 = CONCAT44(fStack_54c,fStack_550);
      local_2c = 0x17;
      local_558 = (float)(iVar4 * 0x800000);
      local_598 = CONCAT44(fStack_554,local_558);
      uStack_590 = CONCAT44(fStack_54c,fStack_550);
      local_438 = local_588;
      uStack_430 = uStack_580;
      local_468 = local_468 * local_558;
      fStack_464 = fStack_464 * fStack_554;
      fStack_460 = fStack_460 * fStack_550;
      fStack_45c = fStack_45c * fStack_54c;
      local_588 = CONCAT44(fStack_464,local_468);
      uStack_580 = CONCAT44(fStack_45c,fStack_460);
      local_5a8 = local_588;
      uStack_5a0 = uStack_580;
      local_6b8 = 0x3f800000;
      local_6c8 = 0x3f800000;
      local_5b8 = 0x3f8000003f800000;
      uStack_5b0 = 0x3f8000003f800000;
      local_468 = local_468 - 1.0;
      fStack_464 = fStack_464 - 1.0;
      fStack_460 = fStack_460 - 1.0;
      fStack_45c = fStack_45c - 1.0;
      local_708 = CONCAT44(fStack_464,local_468);
      uStack_700._0_4_ = fStack_460;
      uStack_700._4_4_ = fStack_45c;
      local_458 = (float)local_6f8._0_4_;
      fStack_454 = (float)local_6f8._4_4_;
      fStack_450 = fStack_6f0;
      fStack_44c = fStack_6ec;
      local_3e8 = local_708;
      uStack_3e0 = uStack_700;
      local_468 = local_748 * local_468;
      fStack_464 = local_748 * fStack_464;
      fStack_460 = local_748 * fStack_460;
      fStack_45c = local_748 * fStack_45c;
      local_728 = (float)local_6f8._0_4_ + local_468;
      fStack_724 = (float)local_6f8._4_4_ + fStack_464;
      fStack_720 = fStack_6f0 + fStack_460;
      fStack_71c = fStack_6ec + fStack_45c;
      *(ulong *)*local_7b8 = CONCAT44(fStack_724,local_728);
      *(ulong *)(*local_7b8 + 8) = CONCAT44(fStack_71c,fStack_720);
      local_7b8 = local_7b8 + 1;
      local_6e8 = CONCAT44(local_748,local_748);
      uStack_6e0 = CONCAT44(local_748,local_748);
      uStack_6c4 = local_6c8;
      uStack_6c0 = local_6c8;
      uStack_6bc = local_6c8;
      local_618 = local_6d8;
      uStack_610 = uStack_6d0;
      local_5d8 = local_6d8;
      uStack_5d0 = uStack_6d0;
      local_4c8 = local_578;
      uStack_4c0 = uStack_570;
      local_448 = local_598;
      uStack_440 = uStack_590;
      local_418 = local_428;
      uStack_410 = uStack_420;
      local_3f8 = uVar1;
      uStack_3f0 = uVar2;
      local_3d8 = CONCAT44(local_748,local_748);
      uStack_3d0 = CONCAT44(local_748,local_748);
      local_2f0 = local_350;
      local_2e0 = local_340;
      local_290 = local_350;
      local_228 = local_350;
      local_220 = local_280;
      local_1c8 = local_350;
      local_1c0 = local_280;
      local_168 = local_350;
      local_160 = local_280;
      local_108 = local_350;
      local_100 = local_280;
      local_a8 = local_350;
      local_a0 = local_280;
      local_18 = local_598;
      uStack_10 = uStack_590;
    }
    for (; local_810 < local_7ac; local_810 = local_810 + 1) {
      if (*(float *)*local_7b8 <= 0.0 && *(float *)*local_7b8 != 0.0) {
        fVar3 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        fVar6 = expf(*(float *)*local_7b8);
        *(float *)*local_7b8 = fVar3 * (fVar6 - 1.0);
      }
      local_7b8 = (undefined1 (*) [16])(*local_7b8 + 4);
    }
  }
  return 0;
}

Assistant:

int ELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}